

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O2

void __thiscall
adios2::core::Attribute<std::complex<float>_>::~Attribute(Attribute<std::complex<float>_> *this)

{
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_00819610;
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            (&(this->m_DataArray).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>);
  AttributeBase::~AttributeBase(&this->super_AttributeBase);
  return;
}

Assistant:

~Attribute() = default;